

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhjfilter.cpp
# Opt level: O1

void __thiscall
Uhj2Encoder::encode(Uhj2Encoder *this,FloatBufferLine *LeftOut,FloatBufferLine *RightOut,
                   FloatBufferLine *InSamples,size_t SamplesToDo)

{
  array<float,_1152UL> *__dest;
  float *pfVar1;
  float *pfVar2;
  size_t i;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 *puVar7;
  long lVar8;
  array<float,_1280UL> *__dest_00;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  memcpy(&this->mMid,this,0x200);
  lVar8 = SamplesToDo * 4;
  lVar3 = 0;
  do {
    *(float *)((long)(this->mMid)._M_elems + lVar3 + 0x200) =
         *(float *)((long)InSamples->_M_elems + lVar3) * 0.9396926 +
         *(float *)((long)InSamples[1]._M_elems + lVar3) * 0.185574;
    lVar3 = lVar3 + 4;
  } while (lVar8 - lVar3 != 0);
  __dest = &this->mSide;
  memcpy(__dest,&this->mSideDelay,0x200);
  lVar3 = 0;
  do {
    *(float *)((long)(this->mSide)._M_elems + lVar3 + 0x200) =
         *(float *)((long)InSamples[2]._M_elems + lVar3) * 0.6554516;
    lVar3 = lVar3 + 4;
  } while (lVar8 - lVar3 != 0);
  sVar4 = 0;
  do {
    (this->mMid)._M_elems[sVar4 + 0x80] =
         LeftOut->_M_elems[sVar4] + RightOut->_M_elems[sVar4] + (this->mMid)._M_elems[sVar4 + 0x80];
    sVar4 = sVar4 + 1;
  } while (SamplesToDo != sVar4);
  sVar4 = 0;
  do {
    (this->mSide)._M_elems[sVar4 + 0x80] =
         (LeftOut->_M_elems[sVar4] - RightOut->_M_elems[sVar4]) +
         (this->mSide)._M_elems[sVar4 + 0x80];
    sVar4 = sVar4 + 1;
  } while (SamplesToDo != sVar4);
  memmove(this,(this->mMid)._M_elems + SamplesToDo,0x200);
  memmove(&this->mSideDelay,__dest->_M_elems + SamplesToDo,0x200);
  __dest_00 = &this->mTemp;
  memcpy(__dest_00,&this->mSideHistory,0x3fc);
  lVar3 = 0;
  do {
    *(float *)((long)(this->mTemp)._M_elems + lVar3 + 0x3fc) =
         *(float *)((long)InSamples->_M_elems + lVar3) * -0.3420201 +
         *(float *)((long)InSamples[1]._M_elems + lVar3) * 0.5098604;
    lVar3 = lVar3 + 4;
  } while (lVar8 - lVar3 != 0);
  memmove(&this->mSideHistory,__dest_00->_M_elems + SamplesToDo,0x3fc);
  if (SamplesToDo < 2) {
    lVar3 = 0;
  }
  else {
    uVar5 = SamplesToDo >> 1;
    lVar8 = 0;
    do {
      fVar9 = 0.0;
      fVar10 = 0.0;
      fVar11 = 0.0;
      fVar12 = 0.0;
      uVar6 = 0xfffffffffffffffc;
      puVar7 = (anonymous_namespace)::PShiftCoeffs;
      fVar13 = 0.0;
      fVar14 = 0.0;
      fVar15 = 0.0;
      fVar16 = 0.0;
      do {
        pfVar1 = __dest_00->_M_elems + uVar6 * 2 + 8;
        pfVar2 = __dest_00->_M_elems + uVar6 * 2 + 0xc;
        fVar9 = fVar9 + *pfVar1 * *(float *)puVar7;
        fVar10 = fVar10 + pfVar1[2] * *(float *)((long)puVar7 + 4);
        fVar11 = fVar11 + *pfVar2 * *(float *)((long)puVar7 + 8);
        fVar12 = fVar12 + pfVar2[2] * *(float *)((long)puVar7 + 0xc);
        fVar13 = fVar13 + pfVar1[1] * *(float *)puVar7;
        fVar14 = fVar14 + pfVar1[3] * *(float *)((long)puVar7 + 4);
        fVar15 = fVar15 + pfVar2[1] * *(float *)((long)puVar7 + 8);
        fVar16 = fVar16 + pfVar2[3] * *(float *)((long)puVar7 + 0xc);
        uVar6 = uVar6 + 4;
        puVar7 = (undefined1 *)((long)puVar7 + 0x10);
      } while (uVar6 < 0x7c);
      lVar3 = lVar8 + 2;
      *(ulong *)(__dest->_M_elems + lVar8) =
           CONCAT44(fVar16 + fVar13 + fVar14 + fVar15 +
                    (float)((ulong)*(undefined8 *)(__dest->_M_elems + lVar8) >> 0x20),
                    fVar12 + fVar9 + fVar10 + fVar11 +
                    (float)*(undefined8 *)(__dest->_M_elems + lVar8));
      __dest_00 = (array<float,_1280UL> *)(__dest_00->_M_elems + 2);
      uVar5 = uVar5 - 1;
      lVar8 = lVar3;
    } while (uVar5 != 0);
  }
  if ((SamplesToDo & 1) != 0) {
    fVar9 = 0.0;
    fVar10 = 0.0;
    fVar11 = 0.0;
    fVar12 = 0.0;
    uVar5 = 0xfffffffffffffffc;
    puVar7 = (anonymous_namespace)::PShiftCoeffs;
    do {
      fVar9 = fVar9 + __dest_00->_M_elems[uVar5 * 2 + 8] * *(float *)puVar7;
      fVar10 = fVar10 + __dest_00->_M_elems[uVar5 * 2 + 10] * *(float *)((long)puVar7 + 4);
      fVar11 = fVar11 + __dest_00->_M_elems[uVar5 * 2 + 0xc] * *(float *)((long)puVar7 + 8);
      fVar12 = fVar12 + __dest_00->_M_elems[uVar5 * 2 + 0xe] * *(float *)((long)puVar7 + 0xc);
      uVar5 = uVar5 + 4;
      puVar7 = (undefined1 *)((long)puVar7 + 0x10);
    } while (uVar5 < 0x7c);
    __dest->_M_elems[lVar3] = fVar10 + fVar11 + fVar12 + fVar9 + __dest->_M_elems[lVar3];
  }
  sVar4 = 0;
  do {
    LeftOut->_M_elems[sVar4] = ((this->mMid)._M_elems[sVar4] + __dest->_M_elems[sVar4]) * 0.5;
    sVar4 = sVar4 + 1;
  } while (SamplesToDo != sVar4);
  sVar4 = 0;
  do {
    RightOut->_M_elems[sVar4] = ((this->mMid)._M_elems[sVar4] - __dest->_M_elems[sVar4]) * 0.5;
    sVar4 = sVar4 + 1;
  } while (SamplesToDo != sVar4);
  return;
}

Assistant:

void Uhj2Encoder::encode(FloatBufferLine &LeftOut, FloatBufferLine &RightOut,
    const FloatBufferLine *InSamples, const size_t SamplesToDo)
{
    ASSUME(SamplesToDo > 0);

    float *RESTRICT left{al::assume_aligned<16>(LeftOut.data())};
    float *RESTRICT right{al::assume_aligned<16>(RightOut.data())};

    const float *RESTRICT winput{al::assume_aligned<16>(InSamples[0].data())};
    const float *RESTRICT xinput{al::assume_aligned<16>(InSamples[1].data())};
    const float *RESTRICT yinput{al::assume_aligned<16>(InSamples[2].data())};

    /* Combine the previously delayed mid/side signal with the input. */

    /* S = 0.9396926*W + 0.1855740*X */
    auto miditer = std::copy(mMidDelay.cbegin(), mMidDelay.cend(), mMid.begin());
    std::transform(winput, winput+SamplesToDo, xinput, miditer,
        [](const float w, const float x) noexcept -> float
        { return 0.9396926f*w + 0.1855740f*x; });

    /* D = 0.6554516*Y */
    auto sideiter = std::copy(mSideDelay.cbegin(), mSideDelay.cend(), mSide.begin());
    std::transform(yinput, yinput+SamplesToDo, sideiter,
        [](const float y) noexcept -> float { return 0.6554516f*y; });

    /* Include any existing direct signal in the mid/side buffers. */
    for(size_t i{0};i < SamplesToDo;++i,++miditer)
        *miditer += left[i] + right[i];
    for(size_t i{0};i < SamplesToDo;++i,++sideiter)
        *sideiter += left[i] - right[i];

    /* Copy the future samples back to the delay buffers for next time. */
    std::copy_n(mMid.cbegin()+SamplesToDo, mMidDelay.size(), mMidDelay.begin());
    std::copy_n(mSide.cbegin()+SamplesToDo, mSideDelay.size(), mSideDelay.begin());

    /* Now add the all-passed signal into the side signal. */

    /* D += j(-0.3420201*W + 0.5098604*X) */
    auto tmpiter = std::copy(mSideHistory.cbegin(), mSideHistory.cend(), mTemp.begin());
    std::transform(winput, winput+SamplesToDo, xinput, tmpiter,
        [](const float w, const float x) noexcept -> float
        { return -0.3420201f*w + 0.5098604f*x; });
    std::copy_n(mTemp.cbegin()+SamplesToDo, mSideHistory.size(), mSideHistory.begin());
    allpass_process({mSide.data(), SamplesToDo}, mTemp.data());

    /* Left = (S + D)/2.0 */
    for(size_t i{0};i < SamplesToDo;i++)
        left[i] = (mMid[i] + mSide[i]) * 0.5f;
    /* Right = (S - D)/2.0 */
    for(size_t i{0};i < SamplesToDo;i++)
        right[i] = (mMid[i] - mSide[i]) * 0.5f;
}